

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void y8950_write_pcmrom(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  FM_OPL *Y8950;
  
  uVar1 = *(uint *)(*(long *)((long)chip + 0x1738) + 0x28);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)(*(long *)((long)chip + 0x1738) + 8)),data,__n);
  return;
}

Assistant:

void y8950_write_pcmrom(void* chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	FM_OPL *Y8950 = (FM_OPL *)chip;
	
	if (offset > Y8950->deltat->memory_size)
		return;
	if (offset + length > Y8950->deltat->memory_size)
		length = Y8950->deltat->memory_size - offset;
	
	memcpy(Y8950->deltat->memory + offset, data, length);
	
	return;
}